

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

NodeChildIterator * ts_node_iterate_children(TSNode *node)

{
  SubtreeHeapData *pSVar1;
  TSTree *pTVar2;
  TSLanguage *pTVar3;
  NodeChildIterator *in_RDI;
  TSSymbol *pTVar4;
  ulong uVar5;
  
  pSVar1 = *node->id;
  if ((((ulong)pSVar1 & 1) == 0) && (pSVar1->child_count != 0)) {
    pTVar2 = node->tree;
    uVar5 = (ulong)(pSVar1->field_17).field_0.alias_sequence_id;
    if (uVar5 == 0) {
      pTVar4 = (TSSymbol *)0x0;
    }
    else {
      pTVar3 = pTVar2->language;
      pTVar4 = pTVar3->alias_sequences + pTVar3->max_alias_sequence_length * uVar5;
    }
    (in_RDI->parent).ptr = pSVar1;
    in_RDI->tree = pTVar2;
    (in_RDI->position).bytes = node->context[0];
    (in_RDI->position).extent = *(TSPoint *)(node->context + 1);
    in_RDI->child_index = 0;
    in_RDI->structural_child_index = 0;
    in_RDI->alias_sequence = pTVar4;
    return in_RDI;
  }
  (in_RDI->parent).ptr = (SubtreeHeapData *)0x0;
  in_RDI->tree = node->tree;
  in_RDI->alias_sequence = (TSSymbol *)0x0;
  (in_RDI->position).bytes = 0;
  (in_RDI->position).extent.row = 0;
  *(undefined8 *)&(in_RDI->position).extent.column = 0;
  in_RDI->structural_child_index = 0;
  return in_RDI;
}

Assistant:

static inline NodeChildIterator ts_node_iterate_children(const TSNode *node) {
  Subtree subtree = ts_node__subtree(*node);
  if (ts_subtree_child_count(subtree) == 0) {
    return (NodeChildIterator) {NULL_SUBTREE, node->tree, length_zero(), 0, 0, NULL};
  }
  const TSSymbol *alias_sequence = ts_language_alias_sequence(
    node->tree->language,
    subtree.ptr->alias_sequence_id
  );
  return (NodeChildIterator) {
    .tree = node->tree,
    .parent = subtree,
    .position = {ts_node_start_byte(*node), ts_node_start_point(*node)},
    .child_index = 0,
    .structural_child_index = 0,
    .alias_sequence = alias_sequence,
  };
}